

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample_train.cc
# Opt level: O0

void run(vw *vw)

{
  ezexample *this;
  ezexample *label;
  ezexample *this_00;
  ezexample *this_01;
  ezexample *this_02;
  ezexample ex;
  vw_namespace *in_stack_fffffffffffffd08;
  allocator *paVar1;
  ezexample *in_stack_fffffffffffffd10;
  vw *in_stack_fffffffffffffd48;
  ezexample *in_stack_fffffffffffffd50;
  vw *in_stack_fffffffffffffd58;
  ezexample *in_stack_fffffffffffffd60;
  allocator local_231;
  string local_230 [38];
  vw_namespace local_20a;
  allocator local_209;
  string local_208 [37];
  vw_namespace local_1e3;
  vw_namespace local_1e2;
  allocator local_1e1;
  string local_1e0 [38];
  vw_namespace local_1ba;
  allocator local_1b9;
  string local_1b8 [35];
  vw_namespace local_195 [20];
  vw_namespace local_181 [385];
  
  ezexample::ezexample
            (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             SUB81((ulong)in_stack_fffffffffffffd50 >> 0x38,0),in_stack_fffffffffffffd48);
  vw_namespace::vw_namespace(local_181,'s');
  ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  vw_namespace::vw_namespace(local_195,'t');
  ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"1:1",&local_1b9);
  ezexample::set_label(in_stack_fffffffffffffd60,(string *)in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  ezexample::train(in_stack_fffffffffffffd10);
  ezexample::operator--(in_stack_fffffffffffffd10);
  vw_namespace::vw_namespace(&local_1ba,'t');
  ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  ezexample::operator()(in_stack_fffffffffffffd60,(char *)in_stack_fffffffffffffd58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"2:0",&local_1e1);
  ezexample::set_label(in_stack_fffffffffffffd60,(string *)in_stack_fffffffffffffd58);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  ezexample::train(in_stack_fffffffffffffd10);
  ezexample::finish(in_stack_fffffffffffffd50);
  vw_namespace::vw_namespace(&local_1e2,'s');
  this = ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  label = ezexample::operator()(this,(char *)in_stack_fffffffffffffd58);
  this_00 = ezexample::operator()(this,(char *)label);
  ezexample::operator()(this,(char *)label);
  vw_namespace::vw_namespace(&local_1e3,'t');
  ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  ezexample::operator()(this,(char *)label);
  this_01 = ezexample::operator()(this,(char *)label);
  ezexample::operator()(this,(char *)label);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"1:0",&local_209);
  ezexample::set_label(this,(string *)label);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  ezexample::train(in_stack_fffffffffffffd10);
  ezexample::operator--(in_stack_fffffffffffffd10);
  vw_namespace::vw_namespace(&local_20a,'t');
  ezexample::operator()(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  ezexample::operator()(this,(char *)label);
  this_02 = ezexample::operator()(this,(char *)label);
  ezexample::operator()(this,(char *)label);
  paVar1 = &local_231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"2:1",paVar1);
  ezexample::set_label(this,(string *)label);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  ezexample::train(this_02);
  ezexample::finish(this_00);
  ezexample::~ezexample(this_01);
  return;
}

Assistant:

void run(vw*vw)
{ ezexample ex(vw, true);   // we're doing csoaa_ldf so we need multiline examples

  /// BEGIN FIRST MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^the_man")
  ("w^the")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:1");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:0");
  ex.train();

  // push it through VW for training
  ex.finish();

  /// BEGIN SECOND MULTILINE EXAMPLE
  ex(vw_namespace('s'))
  ("p^a_man")
  ("w^a")
  ("w^man")
  (vw_namespace('t'))
  ("p^un_homme")
  ("w^un")
  ("w^homme");

  ex.set_label("1:0");
  ex.train();

  --ex;   // remove the most recent namespace
  ex(vw_namespace('t'))
  ("p^le_homme")
  ("w^le")
  ("w^homme");

  ex.set_label("2:1");
  ex.train();

  // push it through VW for training
  ex.finish();
}